

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void verb_prog_tilt_scales(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  int iVar1;
  char *in_RDX;
  long in_RDI;
  int difference;
  OBJ_AFFECT_DATA oaf;
  OBJ_AFFECT_DATA *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  CHAR_DATA *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  
  iVar2 = *(int *)(in_RDI + 0x124);
  if (*(int *)(in_RDI + 0x120) == 2) {
    send_to_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else if ((*in_RDX == '\0') ||
          ((iVar1 = strcmp(in_RDX,"left"), iVar1 != 0 &&
           (iVar1 = strcmp(in_RDX,"right"), iVar1 != 0)))) {
    send_to_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    iVar1 = strcmp(in_RDX,"left");
    if (iVar1 == 0) {
      if (*(int *)(in_RDI + 0x124) == 0) {
        send_to_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      if (*(int *)(in_RDI + 0x124) == 1) {
        *(int *)(in_RDI + 0x124) = *(int *)(in_RDI + 0x124) + -1;
        send_to_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      if (*(int *)(in_RDI + 0x124) == 2) {
        *(int *)(in_RDI + 0x124) = *(int *)(in_RDI + 0x124) + -1;
        send_to_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    iVar1 = strcmp(in_RDX,"right");
    if (iVar1 == 0) {
      if (*(int *)(in_RDI + 0x124) == 2) {
        send_to_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      if (*(int *)(in_RDI + 0x124) == 1) {
        *(int *)(in_RDI + 0x124) = *(int *)(in_RDI + 0x124) + 1;
        send_to_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      if (*(int *)(in_RDI + 0x124) == 0) {
        *(int *)(in_RDI + 0x124) = *(int *)(in_RDI + 0x124) + 1;
        send_to_char(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    if (iVar2 != *(int *)(in_RDI + 0x124)) {
      init_affect_obj((OBJ_AFFECT_DATA *)0x66b48f);
      affect_to_obj((OBJ_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88)
      ;
    }
  }
  return;
}

Assistant:

void verb_prog_tilt_scales(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	OBJ_AFFECT_DATA oaf;
	int difference = obj->value[2];

	if (obj->value[1] == 2)
	{
		send_to_char("You cannot tilt the scales again yet.\n\r", ch);
		return;
	}

	if (!argument[0] || (strcmp(argument, "left") && strcmp(argument, "right")))
	{
		send_to_char("You can tilt the scales to the left or right.\n\r", ch);
		return;
	}

	if (!strcmp(argument, "left"))
	{
		if (obj->value[2] == 0)
			send_to_char("The scales are already tilted to the left.\n\r", ch);

		if (obj->value[2] == 1)
		{
			obj->value[2]--;
			send_to_char("You tilt the scales so that the left side is weighted...\n\r", ch);
		}

		if (obj->value[2] == 2)
		{
			obj->value[2]--;
			send_to_char("You tilt the scales to the left, balancing them...\n\r", ch);
		}
	}

	if (!strcmp(argument, "right"))
	{
		if (obj->value[2] == 2)
			send_to_char("The scales are already tilted to the right.\n\r", ch);

		if (obj->value[2] == 1)
		{
			obj->value[2]++;
			send_to_char("You tilt the scales so that the right side is weighted...\n\r", ch);
		}

		if (obj->value[2] == 0)
		{
			obj->value[2]++;
			send_to_char("You tilt the scales to the right, balancing them...\n\r", ch);
		}
	}

	if (difference != obj->value[2])
	{
		init_affect_obj(&oaf);
		oaf.where = TO_OBJ_AFFECTS;
		oaf.duration = 12;
		oaf.level = ch->level;
		oaf.modifier = 1;
		oaf.location = APPLY_OBJ_V1;
		oaf.type = gsn_bash;
		oaf.aftype = AFT_SKILL;
		oaf.owner = ch;
		affect_to_obj(obj, &oaf);
	}
}